

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void fmt::v8::detail::fwrite_fully(void *ptr,size_t size,size_t count,FILE *stream)

{
  uint uVar1;
  undefined8 uVar2;
  uint *puVar3;
  format_string<> fmt;
  char *local_68;
  size_t local_60;
  FILE *local_58;
  size_t written;
  FILE *stream_local;
  size_t count_local;
  size_t size_local;
  void *ptr_local;
  char **local_28;
  char *local_20;
  char **local_18;
  void *local_10;
  
  written = (size_t)stream;
  stream_local = (FILE *)count;
  count_local = size;
  size_local = (size_t)ptr;
  local_58 = (FILE *)fwrite(ptr,size,count,(FILE *)stream);
  if (local_58 < stream_local) {
    uVar2 = __cxa_allocate_exception(0x20);
    puVar3 = (uint *)__errno_location();
    uVar1 = *puVar3;
    local_28 = &local_68;
    ptr_local = anon_var_dwarf_8ef78;
    local_20 = "cannot write to file";
    local_68 = "cannot write to file";
    local_18 = local_28;
    local_60 = std::char_traits<char>::length("cannot write to file");
    local_10 = ptr_local;
    fmt.str_.data_ = (char *)(ulong)uVar1;
    fmt.str_.size_ = (size_t)local_68;
    system_error<>((int)uVar2,fmt);
    __cxa_throw(uVar2,&std::system_error::typeinfo,std::system_error::~system_error);
  }
  return;
}

Assistant:

inline void fwrite_fully(const void* ptr, size_t size, size_t count,
                         FILE* stream) {
  size_t written = std::fwrite(ptr, size, count, stream);
  if (written < count) FMT_THROW(system_error(errno, "cannot write to file"));
}